

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login.cpp
# Opt level: O1

bool __thiscall uestc::Client::AuthNetwork(Client *this,UserInfo *u)

{
  undefined8 this_00;
  uint uVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  _Alloc_hider _Var5;
  size_t sVar6;
  string *token;
  size_type *psVar7;
  ulong uVar8;
  long lVar9;
  char *__s;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong __val;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string challenge;
  Result res;
  Params params;
  string check_str;
  string __str_3;
  string __str_2;
  InfoList os;
  string __str_4;
  string hmd5;
  string i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  item;
  allocator_type local_4ea;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4e9;
  string local_4e8;
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [16];
  char local_498 [8];
  _Alloc_hider local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined8 local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  char local_420 [16];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  _Any_data local_3f8;
  char local_3e8 [16];
  string local_3d8;
  string local_3b8;
  string local_398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  
  bVar2 = IsAccessInternet(this);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You have authorized this network, not need to login",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    return true;
  }
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  bVar2 = GetChallenge(this,u,&local_4e8);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"get challenge failed",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    bVar2 = false;
    goto LAB_00109832;
  }
  token = &local_4e8;
  Info(&local_3b8,this,u,token);
  HmacMD5(&local_3d8,(uestc *)&u->password,&local_4e8,token);
  std::operator+(&local_478,&local_4e8,&u->username);
  std::operator+(&local_378.first,&local_4e8,&local_3d8);
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  paVar10 = &local_378.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  std::operator+(&local_378.first,&local_4e8,&u->acid);
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != paVar10) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  std::operator+(&local_378.first,&local_4e8,&u->ip);
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != &local_378.first.field_2) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  local_4a8._0_8_ = local_498;
  std::__cxx11::string::_M_construct((ulong)local_4a8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4a8._0_8_,3,200);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)local_4a8,0,(char *)0x0,(ulong)local_4e8._M_dataplus._M_p);
  local_378.first._M_dataplus._M_p = (pointer)&local_378.first.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_378.first.field_2._M_allocated_capacity = *psVar7;
    local_378.first.field_2._8_8_ = plVar3[3];
  }
  else {
    local_378.first.field_2._M_allocated_capacity = *psVar7;
    local_378.first._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_378.first._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != &local_378.first.field_2) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  if ((char *)local_4a8._0_8_ != local_498) {
    operator_delete((void *)local_4a8._0_8_);
  }
  local_4a8._0_8_ = local_498;
  std::__cxx11::string::_M_construct((ulong)local_4a8,'\x01');
  *(char *)local_4a8._0_8_ = '1';
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)local_4a8,0,(char *)0x0,(ulong)local_4e8._M_dataplus._M_p);
  local_378.first._M_dataplus._M_p = (pointer)&local_378.first.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_378.first.field_2._M_allocated_capacity = *psVar7;
    local_378.first.field_2._8_8_ = plVar3[3];
  }
  else {
    local_378.first.field_2._M_allocated_capacity = *psVar7;
    local_378.first._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_378.first._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != &local_378.first.field_2) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  if ((char *)local_4a8._0_8_ != local_498) {
    operator_delete((void *)local_4a8._0_8_);
  }
  std::operator+(&local_378.first,&local_4e8,&local_3b8);
  std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_378.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.first._M_dataplus._M_p != &local_378.first.field_2) {
    operator_delete(local_378.first._M_dataplus._M_p);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
            (&local_378,(char (*) [7])"device",(char (*) [6])"Linux");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[6],_true>
            (&local_338,(char (*) [9])"platform",(char (*) [6])"Linux");
  __l._M_len = 2;
  __l._M_array = (iterator)&local_378;
  local_458 = this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_410,__l,(allocator_type *)local_4a8);
  lVar9 = -0x80;
  paVar10 = &local_338.second.field_2;
  do {
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    if (paVar10->_M_local_buf + -0x20 != *(char **)(paVar10->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar10->_M_local_buf + -0x30));
    }
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar10->_M_local_buf + -0x40);
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_378,(char (*) [7])"action",(char (*) [6])0x12bb4f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_338,(char (*) [9])"username",&u->username);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                 "{MD5}",&local_3d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2f8,(char (*) [9])"password",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_2b8,(char (*) [6])"ac_id",&u->acid);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_278,(char (*) [3])0x12bee1,&u->ip);
  Sha1(&local_398,&local_478);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_238,(char (*) [7])"chksum",&local_398);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_1f8,(char (*) [5])"info",&local_3b8);
  local_430._M_allocated_capacity = (size_type)local_420;
  std::__cxx11::string::_M_construct((ulong)&local_430,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_430._M_allocated_capacity,3,200);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b8,(char (*) [2])0x12b1d2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_430);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_450,'\x01');
  *local_450._M_dataplus._M_p = '1';
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_178,(char (*) [5])"type",&local_450);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_138,(char (*) [3])"os",
             &(local_410.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_f8,(char (*) [5])0x12b1d8,
             &local_410.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].second);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_const_char_(&)[2],_true>
            (&local_b8,(char (*) [13])"double_stack",(char (*) [2])0x12bc4c);
  lVar9 = std::chrono::_V2::system_clock::now();
  uVar8 = lVar9 / 1000000;
  __val = -uVar8;
  if (0 < (long)uVar8) {
    __val = uVar8;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = __val;
    uVar1 = 4;
    do {
      __len = uVar1;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_001093fe;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_001093fe;
      }
      if (uVar8 < 10000) goto LAB_001093fe;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar1 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_001093fe:
  local_3f8._M_unused._M_object = local_3e8;
  std::__cxx11::string::_M_construct((ulong)&local_3f8,(lVar9 < -999999) + (char)__len);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((ulong)(lVar9 < -999999) + (long)local_3f8._M_unused._0_8_),__len,__val);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_78,(char (*) [2])0x12c097,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3f8);
  __l_00._M_len = 0xd;
  __l_00._M_array = (iterator)&local_378;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_4a8,__l_00,&local_4e9,&local_4ea);
  lVar9 = -0x340;
  paVar10 = &local_78.second.field_2;
  do {
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    if (paVar10->_M_local_buf + -0x20 != *(char **)(paVar10->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar10->_M_local_buf + -0x30));
    }
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar10->_M_local_buf + -0x40);
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  if ((char *)local_3f8._M_unused._0_8_ != local_3e8) {
    operator_delete(local_3f8._M_unused._M_object);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if ((char *)local_430._M_allocated_capacity != local_420) {
    operator_delete((void *)local_430._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if ((Response *)local_4c8._0_8_ != (Response *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if ((_Rb_tree_node_base *)local_490._M_p != (_Rb_tree_node_base *)(local_4a8 + 8)) {
    _Var5._M_p = local_490._M_p;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_378,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)_Var5._M_p + 0x20));
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_378.first._M_dataplus._M_p,
                          local_378.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_378.second._M_dataplus._M_p,local_378.second._M_string_length
                         );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.second._M_dataplus._M_p != &local_378.second.field_2) {
        operator_delete(local_378.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378.first._M_dataplus._M_p != &local_378.first.field_2) {
        operator_delete(local_378.first._M_dataplus._M_p);
      }
      _Var5._M_p = (pointer)std::_Rb_tree_increment(_Var5._M_p);
    } while ((_Rb_tree_node_base *)_Var5._M_p != (_Rb_tree_node_base *)(local_4a8 + 8));
  }
  this_00 = local_458;
  local_378.first.field_2._8_8_ = &local_378.first._M_string_length;
  local_378.first.field_2._M_allocated_capacity = 0;
  local_378.first._M_dataplus._M_p = (pointer)0x0;
  local_378.first._M_string_length = 0;
  local_378.second._M_string_length = 0;
  local_378.second._M_dataplus._M_p = (pointer)local_378.first.field_2._8_8_;
  httplib::ClientImpl::Post
            ((ClientImpl *)local_4c8,
             (char *)(((((unique_ptr<httplib::Client,_std::default_delete<httplib::Client>_> *)
                        (local_458 + 0x20))->_M_t).
                       super___uniq_ptr_impl<httplib::Client,_std::default_delete<httplib::Client>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_httplib::Client_*,_std::default_delete<httplib::Client>_>
                       .super__Head_base<0UL,_httplib::Client_*,_false>._M_head_impl)->cli_)._M_t,
             (Headers *)"/cgi-bin/srun_portal",(Params *)&local_378);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_378);
  if ((Response *)local_4c8._0_8_ == (Response *)0x0) {
    __s = (char *)(ulong)(uint)local_4c8._8_4_;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13c430);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar6);
    }
    poVar4 = (ostream *)&std::cout;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
LAB_001097a5:
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar2 = false;
  }
  else {
    if ((*(int *)(local_4c8._0_8_ + 0x20) != 200) ||
       (bVar2 = IsAccessInternet((Client *)this_00), !bVar2)) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(local_4c8._0_8_ + 0x20));
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(((string *)(local_4c8._0_8_ + 0x78))->_M_dataplus)._M_p,
                          *(size_type *)(local_4c8._0_8_ + 0x80));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      goto LAB_001097a5;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Login status:",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (((string *)(local_4c8._0_8_ + 0x78))->_M_dataplus)._M_p,
                        *(size_type *)(local_4c8._0_8_ + 0x80));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    bVar2 = true;
    std::ostream::flush();
  }
  if ((Response *)local_4c8._0_8_ != (Response *)0x0) {
    httplib::Response::~Response((Response *)local_4c8._0_8_);
    operator_delete((void *)local_4c8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_4a8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
LAB_00109832:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool AuthNetwork(UserInfo& u) {
    if (IsAccessInternet()) {
      std::cout << "You have authorized this network, not need to login"
                << std::endl;
      return true;
    }
    std::string challenge;
    auto ret = GetChallenge(u, challenge);
    if (!ret) {
      std::cout << "get challenge failed" << std::endl;
      return false;
    }

    auto i = Info(u, challenge);
    std::string hmd5 = uestc::HmacMD5(u.password, challenge);
    std::string check_str = challenge + u.username;
    check_str += challenge + hmd5;
    check_str += challenge + u.acid;
    check_str += challenge + u.ip;
    check_str += challenge + std::to_string(N);
    check_str += challenge + std::to_string(TYPE);
    check_str += challenge + i;

    // mock os
    InfoList os = {{"device", "Linux"}, {"platform", "Linux"}};

    httplib::Params params{{"action", "login"},
                           {"username", u.username},
                           {"password", "{MD5}" + hmd5},
                           {"ac_id", u.acid},
                           {"ip", u.ip},
                           {"chksum", CheckSum(check_str)},
                           {"info", i},
                           {"n", std::to_string(N)},
                           {"type", std::to_string(TYPE)},
                           {"os", os[0].second},
                           {"name", os[1].second},
                           {"double_stack", "0"},
                           {"_", std::to_string(GetTimeStamp())}};
    for (auto item : params) {
      std::cout << item.first << ":" << item.second << std::endl;
    }
    if (auto res = client_->Post("/cgi-bin/srun_portal", params)) {
      if (res->status == 200 && IsAccessInternet()) {
        std::cout << "Login status:" << res->body << std::endl;
        return true;
      } else {
        std::cout << res->status << res->body << std::endl;
      }
    } else {
      std::cout << (char*)res.error() << std::endl;
    }
    return false;
  }